

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O2

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CMethod *statement)

{
  CCompoundStm *pCVar1;
  IExpression *pIVar2;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>>
  *this_00;
  string *psVar3;
  string *methodName;
  CLabelStatement *pCVar4;
  CSeqStatement *pCVar5;
  CMoveStatement *pCVar6;
  CMemExpression *this_01;
  IAddress *pIVar7;
  ISubtreeWrapper *_wrapper;
  string *this_02;
  pointer *__ptr;
  CBuildVisitor *this_03;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_168;
  CExpression *local_160;
  CSeqStatement *local_158;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_150;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_148;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_140;
  CLabelStatement *local_138;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_130;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_128;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_120;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_118;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_110;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_108;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_100;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_f8;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_f0;
  unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_> statementListWrapper;
  string methodFullName;
  string local_b0;
  CLabel local_90;
  string local_70;
  CLabel local_50;
  
  std::operator<<((ostream *)&std::cout,"IRT builder: CMethodStm\n");
  std::__cxx11::string::_M_assign((string *)&this->currentMethod);
  this_03 = (CBuildVisitor *)statement;
  buildNewFrame(this,statement);
  psVar3 = IRT::CFrame::GetClassName_abi_cxx11_(this->currentFrame);
  methodName = IRT::CFrame::GetMethodName_abi_cxx11_(this->currentFrame);
  GetMethodFullName(&methodFullName,this_03,psVar3,methodName);
  pCVar1 = (statement->statements)._M_t.
           super___uniq_ptr_impl<CCompoundStm,_std::default_delete<CCompoundStm>_>._M_t.
           super__Tuple_impl<0UL,_CCompoundStm_*,_std::default_delete<CCompoundStm>_>.
           super__Head_base<0UL,_CCompoundStm_*,_false>._M_head_impl;
  (*(code *)**(undefined8 **)&(pCVar1->super_IStatement).super_PositionedNode)(pCVar1,this);
  statementListWrapper._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl =
       (__uniq_ptr_data<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>,_true,_true>
       )(this->wrapper)._M_t.
        super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t
        .super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
        super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
  (this->wrapper)._M_t.
  super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
  super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
  super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = (ISubtreeWrapper *)0x0;
  pIVar2 = (statement->returnExp)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  (*(code *)*(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
  (**((this->wrapper)._M_t.
      super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
      super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
      super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl)->_vptr_ISubtreeWrapper)
            (&local_168);
  local_160 = (CExpression *)local_168._M_head_impl;
  if ((__uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>)
      statementListWrapper._M_t.
      super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
      super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
      super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>)0x0) {
    _wrapper = (ISubtreeWrapper *)operator_new(0x10);
    local_158 = (CSeqStatement *)operator_new(0x18);
    pCVar4 = (CLabelStatement *)operator_new(0x28);
    local_138 = pCVar4;
    std::__cxx11::string::string((string *)&local_b0,(string *)&methodFullName);
    psVar3 = &local_b0;
    IRT::CLabel::CLabel(&local_90,psVar3);
    this_02 = (string *)&local_90;
    IRT::CLabelStatement::CLabelStatement(pCVar4,(CLabel *)this_02);
    local_150._M_head_impl = (CStatement *)pCVar4;
    pCVar6 = (CMoveStatement *)operator_new(0x18);
    pIVar7 = IRT::CFrame::GetReturnValueAddress(this->currentFrame);
    (*pIVar7->_vptr_IAddress[2])(&local_168,pIVar7);
    local_128._M_head_impl = (CExpression *)local_168._M_head_impl;
    local_168._M_head_impl = (CStatement *)0x0;
    local_130._M_head_impl = local_160;
    IRT::CMoveStatement::CMoveStatement
              (pCVar6,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       *)&local_128,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_130);
    pCVar5 = local_158;
    local_120._M_head_impl = (CStatement *)pCVar6;
    IRT::CSeqStatement::CSeqStatement
              (local_158,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_150,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_120);
    _wrapper->_vptr_ISubtreeWrapper = (_func_int **)&PTR_ToExpression_0017b4c8;
    _wrapper[1]._vptr_ISubtreeWrapper = (_func_int **)pCVar5;
    updateSubtreeWrapper(this,_wrapper);
    if ((CMoveStatement *)local_120._M_head_impl != (CMoveStatement *)0x0) {
      (*((INode *)&((local_120._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
        _vptr_INode[2])();
    }
    local_120._M_head_impl = (CStatement *)0x0;
    if (local_130._M_head_impl != (CExpression *)0x0) {
      (*(((IStatement *)&(local_130._M_head_impl)->super_IExpression)->super_INode)._vptr_INode[2])
                ();
    }
    local_130._M_head_impl = (CExpression *)0x0;
    if (local_128._M_head_impl != (CExpression *)0x0) {
      (*(((IStatement *)&(local_128._M_head_impl)->super_IExpression)->super_INode)._vptr_INode[2])
                ();
    }
    local_128._M_head_impl = (CExpression *)0x0;
    if (local_168._M_head_impl != (CStatement *)0x0) {
      (*((local_168._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
    }
    if ((CLabelStatement *)local_150._M_head_impl != (CLabelStatement *)0x0) {
      (*((INode *)&((local_150._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
        _vptr_INode[2])();
    }
    local_150._M_head_impl = (CStatement *)0x0;
  }
  else {
    local_158 = (CSeqStatement *)operator_new(0x10);
    local_138 = (CLabelStatement *)operator_new(0x18);
    pCVar4 = (CLabelStatement *)operator_new(0x28);
    std::__cxx11::string::string((string *)&local_70,(string *)&methodFullName);
    psVar3 = &local_70;
    IRT::CLabel::CLabel(&local_50,psVar3);
    this_02 = (string *)&local_50;
    IRT::CLabelStatement::CLabelStatement(pCVar4,(CLabel *)this_02);
    local_140._M_head_impl = (CStatement *)pCVar4;
    pCVar5 = (CSeqStatement *)operator_new(0x18);
    (**(code **)(*(long *)statementListWrapper._M_t.
                          super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
                          .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl + 8))
              (&local_168);
    local_148._M_head_impl = local_168._M_head_impl;
    local_168._M_head_impl = (CStatement *)0x0;
    pCVar6 = (CMoveStatement *)operator_new(0x18);
    this_01 = (CMemExpression *)operator_new(0x10);
    pIVar7 = IRT::CFrame::GetReturnValueAddress(this->currentFrame);
    (*pIVar7->_vptr_IAddress[2])(&local_110,pIVar7);
    local_108._M_head_impl = local_110._M_head_impl;
    local_110._M_head_impl = (CExpression *)0x0;
    IRT::CMemExpression::CMemExpression
              (this_01,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                        *)&local_108);
    local_118._M_head_impl = local_160;
    local_100._M_head_impl = (CExpression *)this_01;
    IRT::CMoveStatement::CMoveStatement
              (pCVar6,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       *)&local_100,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_118);
    local_f8._M_head_impl = (CStatement *)pCVar6;
    IRT::CSeqStatement::CSeqStatement
              (pCVar5,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                       *)&local_148,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_f8);
    pCVar4 = local_138;
    local_f0._M_head_impl = (CStatement *)pCVar5;
    IRT::CSeqStatement::CSeqStatement
              ((CSeqStatement *)local_138,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_140,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_f0);
    (local_158->super_CStatement).super_IStatement.super_INode._vptr_INode =
         (_func_int **)&PTR_ToExpression_0017b4c8;
    (local_158->leftStatement)._M_t.
    super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = &pCVar4->super_CStatement;
    updateSubtreeWrapper(this,(ISubtreeWrapper *)local_158);
    if ((CSeqStatement *)local_f0._M_head_impl != (CSeqStatement *)0x0) {
      (*((INode *)&((local_f0._M_head_impl)->super_IStatement).super_INode._vptr_INode)->_vptr_INode
        [2])();
    }
    local_f0._M_head_impl = (CStatement *)0x0;
    if ((CMoveStatement *)local_f8._M_head_impl != (CMoveStatement *)0x0) {
      (*((INode *)&((local_f8._M_head_impl)->super_IStatement).super_INode._vptr_INode)->_vptr_INode
        [2])();
    }
    local_f8._M_head_impl = (CStatement *)0x0;
    if (local_118._M_head_impl != (CExpression *)0x0) {
      (*(((IStatement *)&(local_118._M_head_impl)->super_IExpression)->super_INode)._vptr_INode[2])
                ();
    }
    local_118._M_head_impl = (CExpression *)0x0;
    if ((CMemExpression *)local_100._M_head_impl != (CMemExpression *)0x0) {
      (*(((CExpression *)&(local_100._M_head_impl)->super_IExpression)->super_IExpression).
        super_INode._vptr_INode[2])();
    }
    local_100._M_head_impl = (CExpression *)0x0;
    if (local_108._M_head_impl != (CExpression *)0x0) {
      (*((local_108._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_108._M_head_impl = (CExpression *)0x0;
    if (local_110._M_head_impl != (CExpression *)0x0) {
      (*((local_110._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    if (local_148._M_head_impl != (CStatement *)0x0) {
      (*((local_148._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
    }
    local_148._M_head_impl = (CStatement *)0x0;
    if (local_168._M_head_impl != (CStatement *)0x0) {
      (*((local_168._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
    }
    if ((CLabelStatement *)local_140._M_head_impl != (CLabelStatement *)0x0) {
      (*((INode *)&((local_140._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
        _vptr_INode[2])();
    }
    local_140._M_head_impl = (CStatement *)0x0;
  }
  std::__cxx11::string::~string(this_02);
  std::__cxx11::string::~string((string *)psVar3);
  this_00 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>>
             *)(this->treesOfMethods).
               super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
  (*((this->wrapper)._M_t.
     super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
     super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
     super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl)->_vptr_ISubtreeWrapper[1])
            (&local_168);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>>
  ::
  _M_emplace_unique<std::__cxx11::string&,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>
            (this_00,&methodFullName,
             (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
             &local_168);
  if (local_168._M_head_impl != (CStatement *)0x0) {
    (*((local_168._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
  }
  std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::~unique_ptr
            (&statementListWrapper);
  std::__cxx11::string::~string((string *)&methodFullName);
  return;
}

Assistant:

void CBuildVisitor::Visit( CMethod &statement ) {

    std::cout << "IRT builder: CMethodStm\n";
    currentMethod = statement.name->name;
    buildNewFrame( &statement );
    std::string methodFullName = GetMethodFullName( currentFrame->GetClassName( ), currentFrame->GetMethodName( ));

    statement.statements->Accept( *this );
    std::unique_ptr<IRT::ISubtreeWrapper> statementListWrapper = std::move( wrapper );

    statement.returnExp->Accept( *this );
    std::unique_ptr<const IRT::CExpression> expressionReturn = std::move( wrapper->ToExpression( ));

    if ( statementListWrapper ) {
        updateSubtreeWrapper( new IRT::CStatementWrapper(
                std::move( std::unique_ptr<const IRT::CStatement>( new IRT::CSeqStatement(
                        std::move( std::unique_ptr<const IRT::CStatement>(
                                new IRT::CLabelStatement( IRT::CLabel( methodFullName )))),
                        std::move( std::unique_ptr<const IRT::CStatement>( new IRT::CSeqStatement(
                                std::move( statementListWrapper->ToStatement( )),
                                std::move( std::unique_ptr<const IRT::CStatement>(
                                        new IRT::CMoveStatement(
                                                std::move( std::unique_ptr<IRT::CExpression>( new IRT::CMemExpression(
                                                        std::move(
                                                                currentFrame->GetReturnValueAddress( )->ToExpression( ))))),
                                                std::move( expressionReturn )
                                        )
                                ))
                        )))
                )))
        ));
    } else {
        updateSubtreeWrapper( new IRT::CStatementWrapper(
                std::move( std::unique_ptr<const IRT::CStatement>( new IRT::CSeqStatement(
                        std::move( std::unique_ptr<const IRT::CStatement>(
                                new IRT::CLabelStatement( IRT::CLabel( methodFullName )))),
                        std::move( std::unique_ptr<const IRT::CStatement>( new IRT::CMoveStatement(
                                std::move( currentFrame->GetReturnValueAddress( )->ToExpression( )),
                                std::move( expressionReturn )
                        )))
                )))
        ));
    }

    treesOfMethods->emplace( methodFullName, std::move( wrapper->ToStatement( )));
}